

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O0

void __thiscall mxx::requests::~requests(requests *this)

{
  bool bVar1;
  reference ppoVar2;
  MPI_Request *r;
  iterator __end2;
  iterator __begin2;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *__range2;
  requests *this_local;
  
  this->_vptr_requests = (_func_int **)&PTR__requests_00294b78;
  __end2 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::begin
                     (&this->m_requests);
  r = (MPI_Request *)
      std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::end(&this->m_requests);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ompi_request_t_**,_std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>_>
                                *)&r);
    if (!bVar1) break;
    ppoVar2 = __gnu_cxx::
              __normal_iterator<ompi_request_t_**,_std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>_>
              ::operator*(&__end2);
    if (*ppoVar2 != (ompi_request_t *)&ompi_request_null) {
      MPI_Request_free(ppoVar2);
    }
    __gnu_cxx::
    __normal_iterator<ompi_request_t_**,_std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~vector(&this->m_requests);
  return;
}

Assistant:

virtual ~requests() {
        // TODO: just use waitall again?
        for (MPI_Request& r : m_requests) {
            if (r != MPI_REQUEST_NULL)
                MPI_Request_free(&r);
        }
    }